

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O3

uchar * wal_q2_read_header(uchar *buffer,wal_q2_header *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint32_t uVar4;
  long lVar5;
  uchar *local_20;
  
  uVar1 = *(undefined8 *)buffer;
  uVar2 = *(undefined8 *)(buffer + 8);
  uVar3 = *(undefined8 *)(buffer + 0x18);
  *(undefined8 *)(out->name + 0x10) = *(undefined8 *)(buffer + 0x10);
  *(undefined8 *)(out->name + 0x18) = uVar3;
  *(undefined8 *)out->name = uVar1;
  *(undefined8 *)(out->name + 8) = uVar2;
  local_20 = buffer + 0x20;
  uVar4 = read_le32(&local_20);
  out->width = uVar4;
  uVar4 = read_le32(&local_20);
  out->height = uVar4;
  lVar5 = 0;
  do {
    uVar4 = read_le32(&local_20);
    out->offsets[lVar5] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  uVar1 = *(undefined8 *)local_20;
  uVar2 = *(undefined8 *)(local_20 + 8);
  uVar3 = *(undefined8 *)(local_20 + 0x18);
  *(undefined8 *)(out->animname + 0x10) = *(undefined8 *)(local_20 + 0x10);
  *(undefined8 *)(out->animname + 0x18) = uVar3;
  *(undefined8 *)out->animname = uVar1;
  *(undefined8 *)(out->animname + 8) = uVar2;
  local_20 = local_20 + 0x20;
  uVar4 = read_le32(&local_20);
  out->flags = uVar4;
  uVar4 = read_le32(&local_20);
  out->contents = uVar4;
  uVar4 = read_le32(&local_20);
  out->value = uVar4;
  return local_20;
}

Assistant:

unsigned char *wal_q2_read_header(const unsigned char *buffer,
								  struct wal_q2_header *out)
{
	int i;
	unsigned char *ptr = (unsigned char *)buffer;
	memcpy(&(out->name), ptr, NAME_LEN);
	ptr += NAME_LEN;
	out->width = read_le32(&ptr);
	out->height = read_le32(&ptr);
	for (i = 0; i < MIP_LEVELS_Q2; i++) {
		out->offsets[i] = read_le32(&ptr);
	}
	memcpy(&(out->animname), ptr, NAME_LEN);
	ptr += NAME_LEN;
	out->flags = read_le32(&ptr);
	out->contents = read_le32(&ptr);
	out->value = read_le32(&ptr);
	return ptr;
}